

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::packColumns(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  Col *pCVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  Dring *pDVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  
  pCVar1 = &(this->u).col;
  pDVar9 = (this->u).col.list.next;
  piVar5 = (this->u).col.max;
  if ((Col *)pDVar9 == pCVar1) {
    uVar10 = 0;
  }
  else {
    piVar6 = (this->u).col.idx;
    piVar7 = (this->u).col.len;
    piVar8 = (this->u).col.start;
    uVar11 = 0;
    do {
      iVar2 = pDVar9->idx;
      if (piVar8[iVar2] != (int)uVar11) goto LAB_0052e9f5;
      iVar3 = piVar7[iVar2];
      uVar10 = (int)uVar11 + iVar3;
      uVar11 = (ulong)uVar10;
      piVar5[iVar2] = iVar3;
      pDVar9 = pDVar9->next;
    } while ((Col *)pDVar9 != pCVar1);
  }
LAB_0052ea35:
  (this->u).col.used = uVar10;
  piVar5[this->thedim] = 0;
  return;
LAB_0052e9f5:
  do {
    iVar2 = pDVar9->idx;
    iVar3 = piVar8[iVar2];
    lVar12 = (long)iVar3;
    piVar8[iVar2] = (int)uVar11;
    iVar4 = piVar7[iVar2];
    piVar5[iVar2] = iVar4;
    if (0 < iVar4) {
      uVar11 = (ulong)(int)uVar11;
      do {
        piVar6[uVar11] = piVar6[lVar12];
        uVar11 = uVar11 + 1;
        lVar12 = lVar12 + 1;
      } while (lVar12 < iVar4 + iVar3);
    }
    uVar10 = (uint)uVar11;
    pDVar9 = pDVar9->next;
  } while ((Col *)pDVar9 != pCVar1);
  goto LAB_0052ea35;
}

Assistant:

void CLUFactor<R>::packColumns()
{
   int n, i, j, l_col;
   Dring* ring, *list;

   int* l_cidx = u.col.idx;
   int* l_clen = u.col.len;
   int* l_cmax = u.col.max;
   int* l_cbeg = u.col.start;

   n = 0;
   list = &(u.col.list);

   for(ring = list->next; ring != list; ring = ring->next)
   {
      l_col = ring->idx;

      if(l_cbeg[l_col] != n)
      {
         do
         {
            l_col = ring->idx;
            i = l_cbeg[l_col];
            l_cbeg[l_col] = n;
            l_cmax[l_col] = l_clen[l_col];
            j = i + l_clen[l_col];

            for(; i < j; ++i)
               l_cidx[n++] = l_cidx[i];

            ring = ring->next;
         }
         while(ring != list);

         goto terminatePackColumns;
      }

      n += l_clen[l_col];

      l_cmax[l_col] = l_clen[l_col];
   }

terminatePackColumns :

   u.col.used = n;
   u.col.max[thedim] = 0;
}